

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::get_msgpack_binary
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this,binary_t *result)

{
  bool bVar1;
  uint *result_00;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_RDI;
  int8_t subtype_7;
  int8_t subtype_6;
  int8_t subtype_5;
  int8_t subtype_4;
  int8_t subtype_3;
  int8_t subtype_2;
  uint32_t len_5;
  int8_t subtype_1;
  uint16_t len_4;
  int8_t subtype;
  uint8_t len_3;
  uint32_t len_2;
  uint16_t len_1;
  uint8_t len;
  anon_class_8_1_6971b95b assign_and_return_true;
  int8_t in_stack_ffffffffffffff9f;
  uint5 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  bool local_58;
  bool local_57;
  unsigned_short in_stack_ffffffffffffffaa;
  uchar len_01;
  ushort len_00;
  input_format_t in_stack_ffffffffffffffac;
  input_format_t format;
  undefined4 in_stack_ffffffffffffffc0;
  ushort in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffffc7;
  byte in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffc9;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 in_stack_ffffffffffffffcb;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar3;
  bool local_1;
  
  result_00 = (uint *)(ulong)(in_RDI->current - 0xc4);
  switch(result_00) {
  case (uint *)0x0:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_char,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffcc,
                                   CONCAT13(in_stack_ffffffffffffffcb,
                                            CONCAT12(in_stack_ffffffffffffffca,
                                                     CONCAT11(in_stack_ffffffffffffffc9,
                                                              in_stack_ffffffffffffffc8)))),
                       CONCAT13(in_stack_ffffffffffffffc7,
                                CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                       (uchar *)result_00);
    in_stack_ffffffffffffffac = in_stack_ffffffffffffffac & 0xffffff;
    if (bVar1) {
      bVar1 = get_binary<unsigned_char>
                        (in_RDI,in_stack_ffffffffffffffac,(uchar)(in_stack_ffffffffffffffaa >> 8),
                         (binary_t *)
                         CONCAT17(in_stack_ffffffffffffffa7,
                                  CONCAT16(in_stack_ffffffffffffffa6,
                                           CONCAT15(in_stack_ffffffffffffffa5,
                                                    in_stack_ffffffffffffffa0))));
      in_stack_ffffffffffffffac = (uint)bVar1 << 0x18;
    }
    local_1 = SUB41(in_stack_ffffffffffffffac >> 0x18,0);
    break;
  case (uint *)0x1:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_short,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffcc,
                                   CONCAT13(in_stack_ffffffffffffffcb,
                                            CONCAT12(in_stack_ffffffffffffffca,
                                                     CONCAT11(in_stack_ffffffffffffffc9,
                                                              in_stack_ffffffffffffffc8)))),
                       CONCAT13(in_stack_ffffffffffffffc7,
                                CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                       (unsigned_short *)result_00);
    format = CONCAT13((char)(in_stack_ffffffffffffffac >> 0x18),
                      (uint3)(ushort)in_stack_ffffffffffffffac);
    if (bVar1) {
      bVar1 = get_binary<unsigned_short>
                        (in_RDI,format,in_stack_ffffffffffffffaa,
                         (binary_t *)
                         CONCAT17(in_stack_ffffffffffffffa7,
                                  CONCAT16(in_stack_ffffffffffffffa6,
                                           CONCAT15(in_stack_ffffffffffffffa5,
                                                    in_stack_ffffffffffffffa0))));
      format = (uint)bVar1 << 0x10;
    }
    local_1 = SUB41(format >> 0x10,0);
    break;
  case (uint *)0x2:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_int,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffcc,
                                   CONCAT13(in_stack_ffffffffffffffcb,
                                            CONCAT12(in_stack_ffffffffffffffca,
                                                     CONCAT11(in_stack_ffffffffffffffc9,
                                                              in_stack_ffffffffffffffc8)))),
                       CONCAT13(in_stack_ffffffffffffffc7,
                                CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                       result_00);
    local_1 = false;
    if (bVar1) {
      local_1 = get_binary<unsigned_int>
                          ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffffc7,
                                       CONCAT16(in_stack_ffffffffffffffc6,
                                                CONCAT24(in_stack_ffffffffffffffc4,
                                                         in_stack_ffffffffffffffc0))),
                           (input_format_t)((ulong)result_00 >> 0x20),(uint)result_00,
                           (binary_t *)in_RDI);
    }
    break;
  case (uint *)0x3:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_char,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffcc,
                                   CONCAT13(in_stack_ffffffffffffffcb,
                                            CONCAT12(in_stack_ffffffffffffffca,
                                                     CONCAT11(in_stack_ffffffffffffffc9,
                                                              in_stack_ffffffffffffffc8)))),
                       CONCAT13(in_stack_ffffffffffffffc7,
                                CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                       (uchar *)result_00);
    len_01 = (uchar)(in_stack_ffffffffffffffaa >> 8);
    in_stack_ffffffffffffffac = in_stack_ffffffffffffffac & 0xffffff00;
    if (bVar1) {
      bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ::get_number<signed_char,false>
                        ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffffcc,
                                     CONCAT13(in_stack_ffffffffffffffcb,
                                              CONCAT12(in_stack_ffffffffffffffca,
                                                       CONCAT11(in_stack_ffffffffffffffc9,
                                                                in_stack_ffffffffffffffc8)))),
                         CONCAT13(in_stack_ffffffffffffffc7,
                                  CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                         (char *)result_00);
      in_stack_ffffffffffffffac = in_stack_ffffffffffffffac & 0xffffff00;
      if (bVar1) {
        bVar1 = get_binary<unsigned_char>
                          (in_RDI,in_stack_ffffffffffffffac,len_01,
                           (binary_t *)
                           CONCAT17(in_stack_ffffffffffffffa7,
                                    CONCAT16(in_stack_ffffffffffffffa6,
                                             CONCAT15(in_stack_ffffffffffffffa5,
                                                      in_stack_ffffffffffffffa0))));
        in_stack_ffffffffffffffac = json;
        if (bVar1) {
          bVar1 = get_msgpack_binary::anon_class_8_1_6971b95b::operator()
                            ((anon_class_8_1_6971b95b *)
                             CONCAT17(in_stack_ffffffffffffffa7,
                                      CONCAT16(in_stack_ffffffffffffffa6,
                                               CONCAT15(in_stack_ffffffffffffffa5,
                                                        in_stack_ffffffffffffffa0))),
                             in_stack_ffffffffffffff9f);
          in_stack_ffffffffffffffac = (input_format_t)bVar1;
        }
      }
    }
    local_1 = SUB41(in_stack_ffffffffffffffac,0);
    break;
  case (uint *)0x4:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_short,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffcc,
                                   CONCAT13(in_stack_ffffffffffffffcb,
                                            CONCAT12(in_stack_ffffffffffffffca,
                                                     CONCAT11(in_stack_ffffffffffffffc9,
                                                              in_stack_ffffffffffffffc8)))),
                       CONCAT13(in_stack_ffffffffffffffc7,
                                CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                       (unsigned_short *)result_00);
    len_00 = in_stack_ffffffffffffffaa & 0xff;
    if (bVar1) {
      bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ::get_number<signed_char,false>
                        ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffffcc,
                                     CONCAT13(in_stack_ffffffffffffffcb,
                                              CONCAT12(in_stack_ffffffffffffffca,
                                                       CONCAT11(in_stack_ffffffffffffffc9,
                                                                in_stack_ffffffffffffffc8)))),
                         CONCAT13(in_stack_ffffffffffffffc7,
                                  CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                         (char *)result_00);
      len_00 = len_00 & 0xff;
      if (bVar1) {
        bVar1 = get_binary<unsigned_short>
                          (in_RDI,in_stack_ffffffffffffffac,len_00,
                           (binary_t *)
                           CONCAT17(in_stack_ffffffffffffffa7,
                                    CONCAT16(in_stack_ffffffffffffffa6,
                                             CONCAT15(in_stack_ffffffffffffffa5,
                                                      in_stack_ffffffffffffffa0))));
        len_00 = 0;
        if (bVar1) {
          bVar1 = get_msgpack_binary::anon_class_8_1_6971b95b::operator()
                            ((anon_class_8_1_6971b95b *)
                             CONCAT17(in_stack_ffffffffffffffa7,
                                      CONCAT16(in_stack_ffffffffffffffa6,
                                               CONCAT15(in_stack_ffffffffffffffa5,
                                                        in_stack_ffffffffffffffa0))),
                             in_stack_ffffffffffffff9f);
          len_00 = (ushort)bVar1 << 8;
        }
      }
    }
    local_1 = SUB21(len_00 >> 8,0);
    break;
  case (uint *)0x5:
    uVar3 = 0;
    uVar2 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_int,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)(ulong)CONCAT12(in_stack_ffffffffffffffca,
                                          CONCAT11(in_stack_ffffffffffffffc9,
                                                   in_stack_ffffffffffffffc8)),
                       CONCAT13(in_stack_ffffffffffffffc7,
                                CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                       result_00);
    local_1 = false;
    if (bVar1) {
      bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ::get_number<signed_char,false>
                        ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)CONCAT44(uVar3,CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffffca,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffffc9,
                                                  in_stack_ffffffffffffffc8)))),
                         CONCAT13(in_stack_ffffffffffffffc7,
                                  CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                         (char *)result_00);
      local_1 = false;
      if (bVar1) {
        bVar1 = get_binary<unsigned_int>
                          ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffffc7,
                                       CONCAT16(in_stack_ffffffffffffffc6,
                                                CONCAT24(in_stack_ffffffffffffffc4,
                                                         in_stack_ffffffffffffffc0))),
                           (input_format_t)((ulong)result_00 >> 0x20),(uint)result_00,
                           (binary_t *)in_RDI);
        local_1 = false;
        if (bVar1) {
          local_1 = get_msgpack_binary::anon_class_8_1_6971b95b::operator()
                              ((anon_class_8_1_6971b95b *)
                               CONCAT17(in_stack_ffffffffffffffa7,
                                        CONCAT16(in_stack_ffffffffffffffa6,
                                                 CONCAT15(in_stack_ffffffffffffffa5,
                                                          in_stack_ffffffffffffffa0))),
                               in_stack_ffffffffffffff9f);
        }
      }
    }
    break;
  default:
    local_1 = false;
    break;
  case (uint *)0x10:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<signed_char,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffcc,
                                   CONCAT13(in_stack_ffffffffffffffcb,
                                            (uint3)CONCAT11(in_stack_ffffffffffffffc9,
                                                            in_stack_ffffffffffffffc8))),
                       CONCAT13(in_stack_ffffffffffffffc7,
                                CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                       (char *)result_00);
    local_57 = false;
    if (bVar1) {
      bVar1 = get_binary<int>((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffc7,
                                          CONCAT16(in_stack_ffffffffffffffc6,
                                                   CONCAT24(in_stack_ffffffffffffffc4,
                                                            in_stack_ffffffffffffffc0))),
                              (input_format_t)((ulong)result_00 >> 0x20),(int)result_00,
                              (binary_t *)in_RDI);
      local_57 = false;
      if (bVar1) {
        local_57 = get_msgpack_binary::anon_class_8_1_6971b95b::operator()
                             ((anon_class_8_1_6971b95b *)
                              CONCAT17(in_stack_ffffffffffffffa7,
                                       CONCAT16(in_stack_ffffffffffffffa6,
                                                CONCAT15(in_stack_ffffffffffffffa5,
                                                         in_stack_ffffffffffffffa0))),
                              in_stack_ffffffffffffff9f);
      }
    }
    local_1 = local_57;
    break;
  case (uint *)0x11:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<signed_char,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffcc,
                                   CONCAT13(in_stack_ffffffffffffffcb,
                                            CONCAT12(in_stack_ffffffffffffffca,
                                                     (ushort)in_stack_ffffffffffffffc8))),
                       CONCAT13(in_stack_ffffffffffffffc7,
                                CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                       (char *)result_00);
    local_58 = false;
    if (bVar1) {
      bVar1 = get_binary<int>((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffc7,
                                          CONCAT16(in_stack_ffffffffffffffc6,
                                                   CONCAT24(in_stack_ffffffffffffffc4,
                                                            in_stack_ffffffffffffffc0))),
                              (input_format_t)((ulong)result_00 >> 0x20),(int)result_00,
                              (binary_t *)in_RDI);
      local_58 = false;
      if (bVar1) {
        local_58 = get_msgpack_binary::anon_class_8_1_6971b95b::operator()
                             ((anon_class_8_1_6971b95b *)
                              CONCAT17(in_stack_ffffffffffffffa7,
                                       CONCAT16(in_stack_ffffffffffffffa6,
                                                CONCAT15(in_stack_ffffffffffffffa5,
                                                         in_stack_ffffffffffffffa0))),
                              in_stack_ffffffffffffff9f);
      }
    }
    local_1 = local_58;
    break;
  case (uint *)0x12:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<signed_char,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)((ulong)CONCAT43(in_stack_ffffffffffffffcc,
                                           CONCAT12(in_stack_ffffffffffffffcb,
                                                    CONCAT11(in_stack_ffffffffffffffca,
                                                             in_stack_ffffffffffffffc9))) << 8),
                       CONCAT13(in_stack_ffffffffffffffc7,
                                CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4)),
                       (char *)result_00);
    local_1 = false;
    if (bVar1) {
      bVar1 = get_binary<int>((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffc7,
                                          CONCAT16(in_stack_ffffffffffffffc6,
                                                   CONCAT24(in_stack_ffffffffffffffc4,
                                                            in_stack_ffffffffffffffc0))),
                              (input_format_t)((ulong)result_00 >> 0x20),(int)result_00,
                              (binary_t *)in_RDI);
      local_1 = false;
      if (bVar1) {
        local_1 = get_msgpack_binary::anon_class_8_1_6971b95b::operator()
                            ((anon_class_8_1_6971b95b *)
                             (ulong)CONCAT16(in_stack_ffffffffffffffa6,
                                             CONCAT15(in_stack_ffffffffffffffa5,
                                                      in_stack_ffffffffffffffa0)),
                             in_stack_ffffffffffffff9f);
      }
    }
    break;
  case (uint *)0x13:
    uVar2 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<signed_char,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffcc,
                                   CONCAT13(in_stack_ffffffffffffffcb,
                                            CONCAT12(in_stack_ffffffffffffffca,
                                                     CONCAT11(in_stack_ffffffffffffffc9,
                                                              in_stack_ffffffffffffffc8)))),
                       (uint)CONCAT12(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc4),
                       (char *)result_00);
    local_1 = false;
    if (bVar1) {
      bVar1 = get_binary<int>((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffc6,
                                                         CONCAT24(in_stack_ffffffffffffffc4,
                                                                  in_stack_ffffffffffffffc0))),
                              (input_format_t)((ulong)result_00 >> 0x20),(int)result_00,
                              (binary_t *)in_RDI);
      local_1 = false;
      if (bVar1) {
        local_1 = get_msgpack_binary::anon_class_8_1_6971b95b::operator()
                            ((anon_class_8_1_6971b95b *)
                             CONCAT17(in_stack_ffffffffffffffa7,
                                      (uint7)CONCAT15(in_stack_ffffffffffffffa5,
                                                      in_stack_ffffffffffffffa0)),
                             in_stack_ffffffffffffff9f);
      }
    }
    break;
  case (uint *)0x14:
    uVar2 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<signed_char,false>
                      ((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffcc,
                                   CONCAT13(in_stack_ffffffffffffffcb,
                                            CONCAT12(in_stack_ffffffffffffffca,
                                                     CONCAT11(in_stack_ffffffffffffffc9,
                                                              in_stack_ffffffffffffffc8)))),
                       CONCAT13(in_stack_ffffffffffffffc7,(uint3)in_stack_ffffffffffffffc4),
                       (char *)result_00);
    local_1 = false;
    if (bVar1) {
      bVar1 = get_binary<int>((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffffc7,
                                          CONCAT16(uVar2,CONCAT24(in_stack_ffffffffffffffc4,
                                                                  in_stack_ffffffffffffffc0))),
                              (input_format_t)((ulong)result_00 >> 0x20),(int)result_00,
                              (binary_t *)in_RDI);
      local_1 = false;
      if (bVar1) {
        local_1 = get_msgpack_binary::anon_class_8_1_6971b95b::operator()
                            ((anon_class_8_1_6971b95b *)
                             CONCAT17(in_stack_ffffffffffffffa7,
                                      CONCAT16(in_stack_ffffffffffffffa6,
                                               (uint6)in_stack_ffffffffffffffa0)),
                             in_stack_ffffffffffffff9f);
      }
    }
  }
  return local_1;
}

Assistant:

bool get_msgpack_binary(binary_t& result)
    {
        // helper function to set the subtype
        auto assign_and_return_true = [&result](std::int8_t subtype)
        {
            result.set_subtype(static_cast<std::uint8_t>(subtype));
            return true;
        };

        switch (current)
        {
            case 0xC4: // bin 8
            {
                std::uint8_t len{};
                return get_number(input_format_t::msgpack, len) &&
                       get_binary(input_format_t::msgpack, len, result);
            }

            case 0xC5: // bin 16
            {
                std::uint16_t len{};
                return get_number(input_format_t::msgpack, len) &&
                       get_binary(input_format_t::msgpack, len, result);
            }

            case 0xC6: // bin 32
            {
                std::uint32_t len{};
                return get_number(input_format_t::msgpack, len) &&
                       get_binary(input_format_t::msgpack, len, result);
            }

            case 0xC7: // ext 8
            {
                std::uint8_t len{};
                std::int8_t subtype{};
                return get_number(input_format_t::msgpack, len) &&
                       get_number(input_format_t::msgpack, subtype) &&
                       get_binary(input_format_t::msgpack, len, result) &&
                       assign_and_return_true(subtype);
            }

            case 0xC8: // ext 16
            {
                std::uint16_t len{};
                std::int8_t subtype{};
                return get_number(input_format_t::msgpack, len) &&
                       get_number(input_format_t::msgpack, subtype) &&
                       get_binary(input_format_t::msgpack, len, result) &&
                       assign_and_return_true(subtype);
            }

            case 0xC9: // ext 32
            {
                std::uint32_t len{};
                std::int8_t subtype{};
                return get_number(input_format_t::msgpack, len) &&
                       get_number(input_format_t::msgpack, subtype) &&
                       get_binary(input_format_t::msgpack, len, result) &&
                       assign_and_return_true(subtype);
            }

            case 0xD4: // fixext 1
            {
                std::int8_t subtype{};
                return get_number(input_format_t::msgpack, subtype) &&
                       get_binary(input_format_t::msgpack, 1, result) &&
                       assign_and_return_true(subtype);
            }

            case 0xD5: // fixext 2
            {
                std::int8_t subtype{};
                return get_number(input_format_t::msgpack, subtype) &&
                       get_binary(input_format_t::msgpack, 2, result) &&
                       assign_and_return_true(subtype);
            }

            case 0xD6: // fixext 4
            {
                std::int8_t subtype{};
                return get_number(input_format_t::msgpack, subtype) &&
                       get_binary(input_format_t::msgpack, 4, result) &&
                       assign_and_return_true(subtype);
            }

            case 0xD7: // fixext 8
            {
                std::int8_t subtype{};
                return get_number(input_format_t::msgpack, subtype) &&
                       get_binary(input_format_t::msgpack, 8, result) &&
                       assign_and_return_true(subtype);
            }

            case 0xD8: // fixext 16
            {
                std::int8_t subtype{};
                return get_number(input_format_t::msgpack, subtype) &&
                       get_binary(input_format_t::msgpack, 16, result) &&
                       assign_and_return_true(subtype);
            }

            default:           // LCOV_EXCL_LINE
                return false;  // LCOV_EXCL_LINE
        }
    }